

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O3

int ffikye(fitsfile *fptr,char *keyname,float value,int decim,char *comm,int *status)

{
  char valstring [71];
  char card [81];
  char acStack_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  ffr2e(value,decim,acStack_d8,status);
  ffmkky(keyname,acStack_d8,comm,local_88,status);
  ffikey(fptr,local_88,status);
  return *status;
}

Assistant:

int ffikye(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           float value,             /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */ 
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffr2e(value, decim, valstring, status);   /* convert to formatted string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffikey(fptr, card, status);  /* write the keyword*/

    return(*status);
}